

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_SimRsbFree(Gia_SimRsbMan_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  
  Gia_ManStaticFanoutStop(p->pGia);
  pVVar1 = p->vTfo;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vCands;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vFanins;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar1 = p->vFanins2;
  piVar2 = pVVar1->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar1);
  pVVar3 = p->vSimsObj;
  pwVar4 = pVVar3->pArray;
  if (pwVar4 != (word *)0x0) {
    free(pwVar4);
  }
  free(pVVar3);
  pVVar3 = p->vSimsObj2;
  pwVar4 = pVVar3->pArray;
  if (pwVar4 != (word *)0x0) {
    free(pwVar4);
  }
  free(pVVar3);
  if (p->pFunc[0] != (word *)0x0) {
    free(p->pFunc[0]);
    p->pFunc[0] = (word *)0x0;
  }
  if (p->pFunc[1] != (word *)0x0) {
    free(p->pFunc[1]);
    p->pFunc[1] = (word *)0x0;
  }
  if (p->pFunc[2] != (word *)0x0) {
    free(p->pFunc[2]);
  }
  free(p);
  return;
}

Assistant:

void Gia_SimRsbFree( Gia_SimRsbMan_t * p )
{
    Gia_ManStaticFanoutStop( p->pGia );
    Vec_IntFree( p->vTfo );
    Vec_IntFree( p->vCands );
    Vec_IntFree( p->vFanins );
    Vec_IntFree( p->vFanins2 );
    Vec_WrdFree( p->vSimsObj );
    Vec_WrdFree( p->vSimsObj2 );
    ABC_FREE( p->pFunc[0] );
    ABC_FREE( p->pFunc[1] );
    ABC_FREE( p->pFunc[2] );
    ABC_FREE( p );
}